

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkSuppSizeTest(Abc_Ntk_t *p)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  uint uVar4;
  int level;
  long lVar5;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pVVar2 = p->vObjs;
  if (pVVar2->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar2->pArray[lVar5];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        iVar1 = Abc_ObjSuppSize(pObj);
        uVar4 = uVar4 + (iVar1 < 0x11);
      }
      lVar5 = lVar5 + 1;
      pVVar2 = p->vObjs;
    } while (lVar5 < pVVar2->nSize);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar4,(ulong)(uint)p->nObjCounts[7]);
  level = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  return uVar4;
}

Assistant:

int Abc_NtkSuppSizeTest( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Abc_NtkForEachObj( p, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter += (Abc_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Abc_NtkNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}